

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

string * __thiscall
google::(anonymous_namespace)::FlagValue::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  size_t sVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  char intbuf [64];
  char acStack_58 [72];
  
  pcVar8 = acStack_58;
  switch(*(undefined1 *)((long)this + 8)) {
  case 0:
    bVar1 = **this;
    pcVar8 = "false";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + ((ulong)bVar1 ^ 5);
    goto LAB_00192df2;
  case 1:
    uVar2 = **this;
    pcVar7 = "%d";
    break;
  case 2:
    uVar2 = **this;
    pcVar7 = "%u";
    break;
  case 3:
    uVar6 = **this;
    pcVar7 = "%ld";
    goto LAB_00192d85;
  case 4:
    uVar6 = **this;
    pcVar7 = "%lu";
LAB_00192d85:
    snprintf(acStack_58,0x40,pcVar7,uVar6);
    goto LAB_00192dd9;
  case 5:
    snprintf(acStack_58,0x40,"%.17g",**this);
    goto LAB_00192dd9;
  case 6:
    plVar3 = *this;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar4 = *plVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar4,plVar3[1] + lVar4);
    return __return_storage_ptr__;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x175,"string google::(anonymous namespace)::FlagValue::ToString() const");
  }
  snprintf(acStack_58,0x40,pcVar7,(ulong)uVar2);
LAB_00192dd9:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(acStack_58);
  pcVar7 = acStack_58 + sVar5;
LAB_00192df2:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

string FlagValue::ToString() const {
  char intbuf[64];    // enough to hold even the biggest number
  switch (type_) {
    case FV_BOOL:
      return VALUE_AS(bool) ? "true" : "false";
    case FV_INT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRId32, VALUE_AS(int32));
      return intbuf;
    case FV_UINT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu32, VALUE_AS(uint32));
      return intbuf;
    case FV_INT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRId64, VALUE_AS(int64));
      return intbuf;
    case FV_UINT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu64, VALUE_AS(uint64));
      return intbuf;
    case FV_DOUBLE:
      snprintf(intbuf, sizeof(intbuf), "%.17g", VALUE_AS(double));
      return intbuf;
    case FV_STRING:
      return VALUE_AS(string);
    default:
      assert(false);
      return "";  // unknown type
  }
}